

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O3

ngram_model_t * ngram_model_set_lookup(ngram_model_t *base,char *name)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  
  if (name == (char *)0x0) {
    uVar4 = (ulong)*(int *)&base[1].field_0x4;
    if (uVar4 != 0xffffffffffffffff) goto LAB_0012f4c0;
  }
  else {
    iVar1 = base[1].refcount;
    if ((long)iVar1 < 1) {
      uVar4 = 0;
    }
    else {
      lVar2 = *(long *)&base[1].n_1g_alloc;
      uVar4 = 0;
      while (iVar3 = strcmp(*(char **)(lVar2 + uVar4 * 8),name), iVar3 != 0) {
        uVar4 = uVar4 + 1;
        if ((long)iVar1 == uVar4) {
          return (ngram_model_t *)0x0;
        }
      }
    }
    if ((int)uVar4 != iVar1) {
      uVar4 = uVar4 & 0xffffffff;
LAB_0012f4c0:
      return *(ngram_model_t **)(base[1].n_counts + uVar4 * 2);
    }
  }
  return (ngram_model_t *)0x0;
}

Assistant:

ngram_model_t *
ngram_model_set_lookup(ngram_model_t * base, const char *name)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 i;

    if (name == NULL) {
        if (set->cur == -1)
            return NULL;
        else
            return set->lms[set->cur];
    }

    /* There probably won't be very many submodels. */
    for (i = 0; i < set->n_models; ++i)
        if (0 == strcmp(set->names[i], name))
            break;
    if (i == set->n_models)
        return NULL;
    return set->lms[i];
}